

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

void free_entry(UResourceDataEntry *entry)

{
  uint32_t *puVar1;
  char *buffer;
  UResourceDataEntry *pUVar2;
  UResourceDataEntry *pUVar3;
  
  res_unload_63(&entry->fData);
  buffer = entry->fName;
  if (buffer != entry->fNameBuffer && buffer != (char *)0x0) {
    uprv_free_63(buffer);
  }
  if (entry->fPath != (char *)0x0) {
    uprv_free_63(entry->fPath);
  }
  if (entry->fPool != (UResourceDataEntry *)0x0) {
    puVar1 = &entry->fPool->fCountExisting;
    *puVar1 = *puVar1 - 1;
  }
  pUVar2 = entry->fAlias;
  if (entry->fAlias != (UResourceDataEntry *)0x0) {
    do {
      pUVar3 = pUVar2;
      pUVar2 = pUVar3->fAlias;
    } while (pUVar2 != (UResourceDataEntry *)0x0);
    puVar1 = &pUVar3->fCountExisting;
    *puVar1 = *puVar1 - 1;
  }
  uprv_free_63(entry);
  return;
}

Assistant:

static void
free_entry(UResourceDataEntry *entry) {
    UResourceDataEntry *alias;
    res_unload(&(entry->fData));
    if(entry->fName != NULL && entry->fName != entry->fNameBuffer) {
        uprv_free(entry->fName);
    }
    if(entry->fPath != NULL) {
        uprv_free(entry->fPath);
    }
    if(entry->fPool != NULL) {
        --entry->fPool->fCountExisting;
    }
    alias = entry->fAlias;
    if(alias != NULL) {
        while(alias->fAlias != NULL) {
            alias = alias->fAlias;
        }
        --alias->fCountExisting;
    }
    uprv_free(entry);
}